

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O1

string * __thiscall
cmLocalUnixMakefileGenerator3::CreateMakeVariable
          (string *__return_storage_ptr__,cmLocalUnixMakefileGenerator3 *this,string *s,string *s2)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar1;
  int iVar2;
  pointer pcVar3;
  cmLocalUnixMakefileGenerator3 *pcVar4;
  iterator iVar5;
  long lVar6;
  long *plVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  const_iterator cVar9;
  mapped_type *pmVar10;
  long *plVar11;
  size_type sVar12;
  uint uVar13;
  string ret;
  string unmodified;
  string str1;
  char buffer_1 [5];
  char buffer [5];
  string local_118;
  key_type local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  string *local_98;
  char local_8d [5];
  cmLocalUnixMakefileGenerator3 *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_40;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_38;
  
  paVar8 = &local_f8.field_2;
  pcVar3 = (s->_M_dataplus)._M_p;
  local_f8._M_dataplus._M_p = (pointer)paVar8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_f8,pcVar3,pcVar3 + s->_M_string_length)
  ;
  std::__cxx11::string::_M_append((char *)&local_f8,(ulong)(s2->_M_dataplus)._M_p);
  if (this->MakefileVariableSize == 0) {
    lVar6 = std::__cxx11::string::find((char)&local_f8,0x2e);
    if ((lVar6 == -1) && (this->MakefileVariableSize == 0)) {
      lVar6 = std::__cxx11::string::find((char)&local_f8,0x2b);
      if ((lVar6 == -1) && (this->MakefileVariableSize == 0)) {
        lVar6 = std::__cxx11::string::find((char)&local_f8,0x2d);
        if (lVar6 == -1) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p == paVar8) {
            (__return_storage_ptr__->field_2)._M_allocated_capacity =
                 CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                          local_f8.field_2._M_local_buf[0]);
            *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_f8.field_2._8_8_;
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = local_f8._M_dataplus._M_p;
            (__return_storage_ptr__->field_2)._M_allocated_capacity =
                 CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                          local_f8.field_2._M_local_buf[0]);
          }
          __return_storage_ptr__->_M_string_length = local_f8._M_string_length;
          local_f8._M_string_length = 0;
          local_f8.field_2._M_local_buf[0] = '\0';
          local_f8._M_dataplus._M_p = (pointer)paVar8;
          goto LAB_00409969;
        }
      }
    }
  }
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->MakeVariableMap)._M_t,&local_f8);
  if ((_Rb_tree_header *)iVar5._M_node !=
      &(this->MakeVariableMap)._M_t._M_impl.super__Rb_tree_header) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*(long *)(iVar5._M_node + 2),
               (long)&(iVar5._M_node[2]._M_parent)->_M_color + *(long *)(iVar5._M_node + 2));
    goto LAB_00409969;
  }
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  local_88 = this;
  local_40 = &this->MakeVariableMap;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,local_f8._M_dataplus._M_p,
             local_f8._M_dataplus._M_p + local_f8._M_string_length);
  pcVar4 = local_88;
  iVar2 = local_88->MakefileVariableSize;
  if (iVar2 == 0) {
    if (local_118._M_string_length != 0) {
      sVar12 = 0;
      do {
        if (local_118._M_dataplus._M_p[sVar12] == '.') {
          local_118._M_dataplus._M_p[sVar12] = '_';
        }
        sVar12 = sVar12 + 1;
      } while (local_118._M_string_length != sVar12);
    }
    cmsys::SystemTools::ReplaceString(&local_118,"-","__");
    cmsys::SystemTools::ReplaceString(&local_118,"+","___");
    pmVar1 = &pcVar4->ShortMakeVariableMap;
    uVar13 = 0;
    local_98 = __return_storage_ptr__;
    while( true ) {
      cVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&pmVar1->_M_t,&local_118);
      if ((999 < uVar13) ||
         ((_Rb_tree_header *)cVar9._M_node ==
          &(pcVar4->ShortMakeVariableMap)._M_t._M_impl.super__Rb_tree_header)) break;
      uVar13 = uVar13 + 1;
      sprintf((char *)&local_80,"%04d",(ulong)uVar13);
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d8,local_f8._M_dataplus._M_p,
                 local_f8._M_dataplus._M_p + local_f8._M_string_length);
      std::__cxx11::string::append((char *)&local_d8);
      std::__cxx11::string::operator=((string *)&local_118,(string *)&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
    }
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](pmVar1,&local_118);
    std::__cxx11::string::_M_replace((ulong)pmVar10,0,(char *)pmVar10->_M_string_length,0x5aa798);
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](local_40,&local_f8);
    std::__cxx11::string::_M_assign((string *)pmVar10);
    paVar8 = &local_98->field_2;
    (local_98->_M_dataplus)._M_p = (pointer)paVar8;
    __return_storage_ptr__ = local_98;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) goto LAB_0040992b;
LAB_00409659:
    paVar8->_M_allocated_capacity =
         CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,local_118.field_2._M_local_buf[0]);
    *(undefined8 *)((long)paVar8 + 8) = local_118.field_2._8_8_;
LAB_00409938:
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    __return_storage_ptr__->_M_string_length = local_118._M_string_length;
    local_118._M_string_length = 0;
    local_118.field_2._M_local_buf[0] = '\0';
  }
  else {
    if ((int)local_118._M_string_length <= iVar2) {
LAB_004098f9:
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](local_40,&local_f8);
      std::__cxx11::string::_M_assign((string *)pmVar10);
      paVar8 = &__return_storage_ptr__->field_2;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p == &local_118.field_2) goto LAB_00409659;
LAB_0040992b:
      (__return_storage_ptr__->_M_dataplus)._M_p = local_118._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,local_118.field_2._M_local_buf[0])
      ;
      goto LAB_00409938;
    }
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    pcVar3 = (s->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d8,pcVar3,pcVar3 + s->_M_string_length);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    pcVar3 = (s2->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,pcVar3,pcVar3 + s2->_M_string_length);
    if (iVar2 + -8 < (int)local_80._M_string_length) {
      std::__cxx11::string::substr((ulong)&local_b8,(ulong)&local_80);
      std::__cxx11::string::operator=((string *)&local_80,(string *)&local_b8);
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
    }
    if (iVar2 + -5 < (int)local_d8._M_string_length + (int)local_80._M_string_length) {
      std::__cxx11::string::substr((ulong)&local_b8,(ulong)&local_d8);
      std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_b8);
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
    }
    sprintf(local_8d,"%04d",0);
    std::operator+(&local_60,&local_d8,&local_80);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_60);
    plVar11 = plVar7 + 2;
    if ((long *)*plVar7 == plVar11) {
      local_a8 = *plVar11;
      lStack_a0 = plVar7[3];
      local_b8 = &local_a8;
    }
    else {
      local_a8 = *plVar11;
      local_b8 = (long *)*plVar7;
    }
    local_b0 = plVar7[1];
    *plVar7 = (long)plVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_118,(string *)&local_b8);
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    local_98 = __return_storage_ptr__;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    local_38 = &local_88->ShortMakeVariableMap;
    pmVar1 = &local_88->ShortMakeVariableMap;
    uVar13 = 1;
    while( true ) {
      cVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&local_38->_M_t,&local_118);
      if ((999 < uVar13 - 1) ||
         ((_Rb_tree_header *)cVar9._M_node == &(pmVar1->_M_t)._M_impl.super__Rb_tree_header)) break;
      sprintf(local_8d,"%04d",(ulong)uVar13);
      std::operator+(&local_60,&local_d8,&local_80);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_60);
      plVar11 = plVar7 + 2;
      if ((long *)*plVar7 == plVar11) {
        local_a8 = *plVar11;
        lStack_a0 = plVar7[3];
        local_b8 = &local_a8;
      }
      else {
        local_a8 = *plVar11;
        local_b8 = (long *)*plVar7;
      }
      local_b0 = plVar7[1];
      *plVar7 = (long)plVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_118,(string *)&local_b8);
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      uVar13 = uVar13 + 1;
    }
    if (uVar13 == 0x3e9) {
      cmSystemTools::Error
                ("Borland makefile variable length too long",(char *)0x0,(char *)0x0,(char *)0x0);
      (local_98->_M_dataplus)._M_p = (pointer)&local_98->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p == &local_f8.field_2) {
        (local_98->field_2)._M_allocated_capacity =
             CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,local_f8.field_2._M_local_buf[0])
        ;
        *(undefined8 *)((long)&local_98->field_2 + 8) = local_f8.field_2._8_8_;
      }
      else {
        (local_98->_M_dataplus)._M_p = local_f8._M_dataplus._M_p;
        (local_98->field_2)._M_allocated_capacity =
             CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,local_f8.field_2._M_local_buf[0])
        ;
      }
      local_98->_M_string_length = local_f8._M_string_length;
      local_f8._M_string_length = 0;
      local_f8.field_2._M_local_buf[0] = '\0';
      __return_storage_ptr__ = local_98;
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    }
    else {
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](local_38,&local_118);
      __return_storage_ptr__ = local_98;
      std::__cxx11::string::_M_replace((ulong)pmVar10,0,(char *)pmVar10->_M_string_length,0x5aa798);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if (uVar13 != 0x3e9) goto LAB_004098f9;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,
                    CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                             local_118.field_2._M_local_buf[0]) + 1);
  }
LAB_00409969:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,
                    CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                             local_f8.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalUnixMakefileGenerator3::CreateMakeVariable(
  std::string const& s, std::string const& s2)
{
  std::string unmodified = s;
  unmodified += s2;
  // if there is no restriction on the length of make variables
  // and there are no "." characters in the string, then return the
  // unmodified combination.
  if ((!this->MakefileVariableSize &&
       unmodified.find('.') == std::string::npos) &&
      (!this->MakefileVariableSize &&
       unmodified.find('+') == std::string::npos) &&
      (!this->MakefileVariableSize &&
       unmodified.find('-') == std::string::npos)) {
    return unmodified;
  }

  // see if the variable has been defined before and return
  // the modified version of the variable
  std::map<std::string, std::string>::iterator i =
    this->MakeVariableMap.find(unmodified);
  if (i != this->MakeVariableMap.end()) {
    return i->second;
  }
  // start with the unmodified variable
  std::string ret = unmodified;
  // if this there is no value for this->MakefileVariableSize then
  // the string must have bad characters in it
  if (!this->MakefileVariableSize) {
    std::replace(ret.begin(), ret.end(), '.', '_');
    cmSystemTools::ReplaceString(ret, "-", "__");
    cmSystemTools::ReplaceString(ret, "+", "___");
    int ni = 0;
    char buffer[5];
    // make sure the _ version is not already used, if
    // it is used then add number to the end of the variable
    while (this->ShortMakeVariableMap.count(ret) && ni < 1000) {
      ++ni;
      sprintf(buffer, "%04d", ni);
      ret = unmodified + buffer;
    }
    this->ShortMakeVariableMap[ret] = "1";
    this->MakeVariableMap[unmodified] = ret;
    return ret;
  }

  // if the string is greater than 32 chars it is an invalid variable name
  // for borland make
  if (static_cast<int>(ret.size()) > this->MakefileVariableSize) {
    int keep = this->MakefileVariableSize - 8;
    int size = keep + 3;
    std::string str1 = s;
    std::string str2 = s2;
    // we must shorten the combined string by 4 characters
    // keep no more than 24 characters from the second string
    if (static_cast<int>(str2.size()) > keep) {
      str2 = str2.substr(0, keep);
    }
    if (static_cast<int>(str1.size()) + static_cast<int>(str2.size()) > size) {
      str1 = str1.substr(0, size - str2.size());
    }
    char buffer[5];
    int ni = 0;
    sprintf(buffer, "%04d", ni);
    ret = str1 + str2 + buffer;
    while (this->ShortMakeVariableMap.count(ret) && ni < 1000) {
      ++ni;
      sprintf(buffer, "%04d", ni);
      ret = str1 + str2 + buffer;
    }
    if (ni == 1000) {
      cmSystemTools::Error("Borland makefile variable length too long");
      return unmodified;
    }
    // once an unused variable is found
    this->ShortMakeVariableMap[ret] = "1";
  }
  // always make an entry into the unmodified to variable map
  this->MakeVariableMap[unmodified] = ret;
  return ret;
}